

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::clear(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  MidiEventList *pMVar3;
  int local_18;
  int i;
  int length;
  MidiFile *this_local;
  
  iVar1 = getNumTracks(this);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_18);
    pMVar3 = *ppMVar2;
    if (pMVar3 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(pMVar3);
      operator_delete(pMVar3);
    }
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_18);
    *ppMVar2 = (value_type)0x0;
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  pMVar3 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(pMVar3);
  ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,0);
  *ppMVar2 = pMVar3;
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::clear(&this->m_timemap);
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  return;
}

Assistant:

void MidiFile::clear(void) {
	int length = getNumTracks();
	for (int i=0; i<length; i++) {
		delete m_events[i];
		m_events[i] = NULL;
	}
	m_events.resize(1);
	m_events[0] = new MidiEventList;
	m_timemapvalid=0;
	m_timemap.clear();
	m_theTrackState = TRACK_STATE_SPLIT;
	m_theTimeState = TIME_STATE_ABSOLUTE;
}